

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  pointer peVar1;
  ostream *poVar2;
  pointer peVar3;
  allocator<char> local_99;
  string entryType;
  entry it;
  
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::endl<char,std::char_traits<char>>(poVar2);
  peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (peVar3 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start; peVar3 != peVar1; peVar3 = peVar3 + 1) {
    entry::entry(&it,peVar3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&entryType,"word",&local_99);
    if (it.type == label) {
      std::__cxx11::string::assign((char *)&entryType);
    }
    poVar2 = std::operator<<(out,(string *)&it);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&entryType);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&entryType);
    entry::~entry(&it);
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (auto it : words_) {
    std::string entryType = "word";
    if (it.type == entry_type::label) {
      entryType = "label";
    }
    out << it.word << " " << it.count << " " << entryType << std::endl;
  }
}